

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_himawari8.cc
# Opt level: O2

string * __thiscall
Himawari8ImageHandler::getBasename_abi_cxx11_
          (string *__return_storage_ptr__,Himawari8ImageHandler *this,File *f)

{
  size_t sVar1;
  runtime_error *this_00;
  int *in_R9;
  undefined1 auStack_68 [8];
  _Alloc_hider local_60;
  undefined1 local_58 [28];
  char local_3c [4];
  string text;
  
  lrit::File::getHeader<lrit::AnnotationHeader>((AnnotationHeader *)auStack_68,f);
  text._M_dataplus._M_p = (pointer)&text.field_2;
  if (local_60._M_p == local_58 + 8) {
    text.field_2._8_8_ = local_58._16_8_;
  }
  else {
    text._M_dataplus._M_p = local_60._M_p;
  }
  text._M_string_length = local_58._0_8_;
  local_58._0_8_ = 0;
  local_58[8] = '\0';
  local_60._M_p = local_58 + 8;
  std::__cxx11::string::~string((string *)&local_60);
  sVar1 = util::findLast(&text,'_');
  if (sVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&text);
    std::__cxx11::string::~string((string *)&text);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_3c[0] = 'y';
  local_3c[1] = '\0';
  local_3c[2] = '\0';
  local_3c[3] = '\0';
  util::str<char[48],char[107],char[2],int>
            ((string *)auStack_68,(util *)"Assertion `pos != std::string::npos` failed at ",
             (char (*) [48])
             "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/goesproc/handler_himawari8.cc"
             ,(char (*) [107])0x1c0c61,(char (*) [2])local_3c,in_R9);
  std::runtime_error::runtime_error(this_00,(string *)auStack_68);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string Himawari8ImageHandler::getBasename(const lrit::File& f) const {
  auto text = f.getHeader<lrit::AnnotationHeader>().text;

  // Find last _ in annotation text and use this prefix
  // as identification for this segmented image.
  // Example annotation: IMG_DK01VIS_201712162250_003.lrit
  auto pos = findLast(text, '_');
  ASSERT(pos != std::string::npos);
  return text.substr(0, pos);
}